

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

Vec_Str_t *
Cec_ManSatSolveSeq(Vec_Ptr_t *vPatts,Gia_Man_t *pAig,Cec_ParSat_t *pPars,int nRegs,int *pnPats)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Cec_ManSat_t *p;
  Vec_Str_t *p_00;
  Bar_Progress_t *p_01;
  Gia_Obj_t *pGVar4;
  void *pvVar5;
  void *pvVar6;
  void **ppvVar7;
  long lVar8;
  Vec_Ptr_t *p_02;
  abctime aVar9;
  int v;
  ulong uVar10;
  char *pString;
  ulong uVar11;
  int i_00;
  long lVar12;
  int i;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int local_8c;
  int local_60;
  
  aVar3 = Abc_Clock();
  iVar1 = Vec_PtrReadWordsSimInfo(vPatts);
  Gia_ManSetPhase(pAig);
  Gia_ManLevelNum(pAig);
  Gia_ManIncrementTravId(pAig);
  p = Cec_ManSatCreate(pAig,pPars);
  p_00 = Vec_StrAlloc(pAig->vCos->nSize - pAig->nRegs);
  p_01 = Bar_ProgressStart(_stdout,pAig->vCos->nSize - pAig->nRegs);
  v = 0;
  iVar15 = 0;
  local_8c = iVar1 << 5;
  while ((v < pAig->vCos->nSize && (pGVar4 = Gia_ManCo(pAig,v), pGVar4 != (Gia_Obj_t *)0x0))) {
    Bar_ProgressUpdate(p_01,v,pString);
    uVar14 = (uint)*(undefined8 *)pGVar4;
    if ((~*(ulong *)(pGVar4 + -(ulong)(uVar14 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
      Vec_StrPush(p_00,(uVar14 >> 0x1d & 1) == 0);
    }
    else {
      iVar2 = Cec_ManSatCheckNode(p,(Gia_Obj_t *)
                                    ((ulong)(uVar14 >> 0x1d & 1) ^
                                    (ulong)(pGVar4 + -(ulong)(uVar14 & 0x1fffffff))));
      Vec_StrPush(p_00,(char)iVar2);
      if (iVar2 == 0) {
        if (iVar15 == local_8c) {
          iVar2 = Vec_PtrReadWordsSimInfo(vPatts);
          if (vPatts->nSize < 2) {
            __assert_fail("Vec_PtrSize(vInfo) > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x434,"void Vec_PtrReallocSimInfo(Vec_Ptr_t *)");
          }
          pvVar5 = Vec_PtrEntry(vPatts,1);
          pvVar6 = Vec_PtrEntry(vPatts,0);
          uVar14 = vPatts->nSize;
          uVar16 = (ulong)(int)uVar14;
          iVar13 = (int)((ulong)((long)pvVar5 - (long)pvVar6) >> 2);
          lVar12 = (long)(iVar13 * 2);
          ppvVar7 = (void **)malloc((lVar12 * 4 + 8) * uVar16);
          uVar10 = 0;
          if (0 < (int)uVar14) {
            uVar10 = (ulong)uVar14;
          }
          lVar8 = uVar16 << 3;
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            ppvVar7[uVar11] = (void *)((long)ppvVar7 + lVar8);
            lVar8 = lVar8 + lVar12 * 4;
          }
          p_02 = (Vec_Ptr_t *)malloc(0x10);
          p_02->nSize = uVar14;
          p_02->nCap = uVar14;
          p_02->pArray = ppvVar7;
          for (i_00 = 0; i_00 < (int)uVar16; i_00 = i_00 + 1) {
            pvVar5 = Vec_PtrEntry(p_02,i_00);
            pvVar6 = Vec_PtrEntry(vPatts,i_00);
            memcpy(pvVar5,pvVar6,(long)(iVar13 << 2));
            uVar16 = (ulong)(uint)vPatts->nSize;
          }
          free(vPatts->pArray);
          vPatts->pArray = ppvVar7;
          free(p_02);
          for (iVar13 = 0; iVar13 < vPatts->nSize; iVar13 = iVar13 + 1) {
            pvVar5 = Vec_PtrEntry(vPatts,iVar13);
            memset((void *)((long)pvVar5 + (long)(iVar2 << 2)),0,(long)(iVar2 << 2));
          }
          local_8c = Vec_PtrReadWordsSimInfo(vPatts);
          local_8c = local_8c << 5;
        }
        iVar2 = iVar15 + (uint)(iVar15 % (iVar1 << 5) == 0);
        Gia_ManIncrementTravId(pAig);
        iVar15 = iVar2 + 1;
        Cec_ManSatSolveSeq_rec
                  (p,pAig,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff),vPatts,iVar2,
                   nRegs);
      }
    }
    v = v + 1;
  }
  aVar9 = Abc_Clock();
  local_60 = (int)aVar3;
  p->timeTotal = (int)aVar9 - local_60;
  Bar_ProgressStop(p_01);
  if (pPars->fVerbose != 0) {
    Cec_ManSatPrintStats(p);
  }
  Cec_ManSatStop(p);
  if (pnPats != (int *)0x0) {
    *pnPats = iVar15 + -1;
  }
  return p_00;
}

Assistant:

Vec_Str_t * Cec_ManSatSolveSeq( Vec_Ptr_t * vPatts, Gia_Man_t * pAig, Cec_ParSat_t * pPars, int nRegs, int * pnPats )
{
    Bar_Progress_t * pProgress = NULL;
    Vec_Str_t * vStatus;
    Cec_ManSat_t * p;
    Gia_Obj_t * pObj;
    int iPat = 0, nPatsInit, nPats;
    int i, status;
    abctime clk = Abc_Clock();
    nPatsInit = nPats = 32 * Vec_PtrReadWordsSimInfo(vPatts);
    Gia_ManSetPhase( pAig );
    Gia_ManLevelNum( pAig );
    Gia_ManIncrementTravId( pAig );
    p = Cec_ManSatCreate( pAig, pPars );
    vStatus = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    pProgress = Bar_ProgressStart( stdout, Gia_ManPoNum(pAig) );
    Gia_ManForEachCo( pAig, pObj, i )
    {
        Bar_ProgressUpdate( pProgress, i, "SAT..." );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
        {
            if ( Gia_ObjFaninC0(pObj) )
            {
//                Abc_Print( 1, "Constant 1 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                Abc_Print( 1, "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        status = Cec_ManSatCheckNode( p, Gia_ObjChild0(pObj) );
//Abc_Print( 1, "output %d   status = %d\n", i, status );
        Vec_StrPush( vStatus, (char)status );
        if ( status != 0 )
            continue;
        // resize storage
        if ( iPat == nPats )
        {
            int nWords = Vec_PtrReadWordsSimInfo(vPatts);
            Vec_PtrReallocSimInfo( vPatts );
            Vec_PtrCleanSimInfo( vPatts, nWords, 2*nWords );
            nPats = 32 * Vec_PtrReadWordsSimInfo(vPatts);
        }
        if ( iPat % nPatsInit == 0 )
            iPat++;
        // save the pattern
        Gia_ManIncrementTravId( pAig );
//        Vec_IntClear( p->vCex );
        Cec_ManSatSolveSeq_rec( p, pAig, Gia_ObjFanin0(pObj), vPatts, iPat++, nRegs );
//        Gia_SatVerifyPattern( pAig, pObj, p->vCex, p->vVisits );
//        Cec_ManSatAddToStore( p->vCexStore, p->vCex );
//        if ( iPat == nPats )
//            break;
        // quit if one of them is solved
//        if ( pPars->fFirstStop )
//            break;
//        if ( iPat == 32 * 15 * 16 - 1 )
//            break;
    }
    p->timeTotal = Abc_Clock() - clk;
    Bar_ProgressStop( pProgress );
    if ( pPars->fVerbose )
        Cec_ManSatPrintStats( p );
//    Abc_Print( 1, "Total number of cex literals = %d. (Ave = %d)\n", p->nCexLits, p->nCexLits/p->nSatSat );
    Cec_ManSatStop( p );
    if ( pnPats )
        *pnPats = iPat-1;
    return vStatus;
}